

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O1

bool __thiscall Item::operator<(Item *this,Item *o)

{
  uint uVar1;
  int *piVar2;
  int *piVar3;
  int iVar4;
  ulong uVar5;
  byte bVar6;
  ulong uVar7;
  runtime_error *this_00;
  ulong uVar8;
  int iVar9;
  int iVar10;
  bool bVar11;
  char _error_msg_ [256];
  char acStack_118 [264];
  
  uVar1 = this->ndims;
  uVar7 = (ulong)uVar1;
  if (uVar1 != o->ndims) {
    snprintf(acStack_118,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "ndims == o.ndims",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
             ,0x11);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,acStack_118);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar9 = o->key;
  iVar10 = this->key;
  bVar11 = SBORROW4(iVar10,iVar9);
  iVar4 = iVar10 - iVar9;
  if (iVar10 == iVar9) {
    bVar11 = 0 < (int)uVar1;
    if (0 < (int)uVar1) {
      piVar2 = (this->w).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar3 = (o->w).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      iVar9 = *piVar2;
      iVar10 = *piVar3;
      if (iVar9 == iVar10) {
        uVar5 = 1;
        do {
          uVar8 = uVar5;
          if (uVar7 == uVar8) {
            bVar11 = uVar8 < uVar7;
            goto LAB_001030c0;
          }
          iVar9 = piVar2[uVar8];
          iVar10 = piVar3[uVar8];
          uVar5 = uVar8 + 1;
        } while (iVar9 == iVar10);
        bVar11 = uVar8 < uVar7;
      }
      uVar7 = (ulong)(iVar9 < iVar10);
    }
LAB_001030c0:
    bVar6 = (byte)uVar7;
    if (bVar11) goto LAB_001030cd;
    bVar11 = SBORROW4(this->demand,o->demand);
    iVar4 = this->demand - o->demand;
  }
  bVar6 = bVar11 != iVar4 < 0;
LAB_001030cd:
  return (bool)(bVar6 & 1);
}

Assistant:

bool Item::operator<(const Item &o) const {
	throw_assert(ndims == o.ndims);
	if (abs(key - o.key) >= 1e-5) {
		return key < o.key;
	}
	for (int i = 0; i < ndims; i++) {
		if (w[i] != o.w[i]) {
			return w[i] < o.w[i];
		}
	}
	return demand < o.demand;
}